

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::ParseURL
               (string *URL,string *protocol,string *username,string *password,string *hostname,
               string *dataport,string *database)

{
  bool bVar1;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  undefined4 local_120;
  undefined1 local_110 [8];
  RegularExpression urlRe;
  string *dataport_local;
  string *hostname_local;
  string *password_local;
  string *username_local;
  string *protocol_local;
  string *URL_local;
  
  urlRe._200_8_ = dataport;
  RegularExpression::RegularExpression
            ((RegularExpression *)local_110,
             "([a-zA-Z0-9]*)://(([A-Za-z0-9]+)(:([^:@]+))?@)?([^:@/]+)(:([0-9]+))?/(.+)?");
  bVar1 = RegularExpression::find((RegularExpression *)local_110,URL);
  if (bVar1) {
    RegularExpression::match_abi_cxx11_(&local_140,(RegularExpression *)local_110,1);
    std::__cxx11::string::operator=((string *)protocol,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    RegularExpression::match_abi_cxx11_(&local_160,(RegularExpression *)local_110,3);
    std::__cxx11::string::operator=((string *)username,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    RegularExpression::match_abi_cxx11_(&local_180,(RegularExpression *)local_110,5);
    std::__cxx11::string::operator=((string *)password,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    RegularExpression::match_abi_cxx11_(&local_1a0,(RegularExpression *)local_110,6);
    std::__cxx11::string::operator=((string *)hostname,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    RegularExpression::match_abi_cxx11_(&local_1c0,(RegularExpression *)local_110,8);
    std::__cxx11::string::operator=((string *)urlRe._200_8_,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    RegularExpression::match_abi_cxx11_(&local_1e0,(RegularExpression *)local_110,9);
    std::__cxx11::string::operator=((string *)database,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  local_120 = 1;
  RegularExpression::~RegularExpression((RegularExpression *)local_110);
  return bVar1;
}

Assistant:

bool SystemTools::ParseURL(const std::string& URL, std::string& protocol,
                           std::string& username, std::string& password,
                           std::string& hostname, std::string& dataport,
                           std::string& database)
{
  kwsys::RegularExpression urlRe(VTK_URL_REGEX);
  if (!urlRe.find(URL))
    return false;

  // match 0 URL
  // match 1 protocol
  // match 2 mangled user
  // match 3 username
  // match 4 mangled password
  // match 5 password
  // match 6 hostname
  // match 7 mangled port
  // match 8 dataport
  // match 9 database name

  protocol = urlRe.match(1);
  username = urlRe.match(3);
  password = urlRe.match(5);
  hostname = urlRe.match(6);
  dataport = urlRe.match(8);
  database = urlRe.match(9);

  return true;
}